

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O0

void PrintUsers(InstructionVMGraphContext *ctx,VmValue *value,bool fullNames)

{
  uint uVar1;
  VmValue **ppVVar2;
  uint local_20;
  uint i;
  bool fullNames_local;
  VmValue *value_local;
  InstructionVMGraphContext *ctx_local;
  
  if ((ctx->showUsers & 1U) != 0) {
    Print(ctx,"[");
    if ((value->hasSideEffects & 1U) != 0) {
      Print(ctx,"self");
    }
    for (local_20 = 0; uVar1 = SmallArray<VmValue_*,_8U>::size(&value->users), local_20 < uVar1;
        local_20 = local_20 + 1) {
      if (((value->hasSideEffects & 1U) != 0) || (local_20 != 0)) {
        Print(ctx,", ");
      }
      ppVVar2 = SmallArray<VmValue_*,_8U>::operator[](&value->users,local_20);
      PrintName(ctx,*ppVVar2,fullNames,true);
    }
    Print(ctx,"] ");
  }
  return;
}

Assistant:

void PrintUsers(InstructionVMGraphContext &ctx, VmValue *value, bool fullNames)
{
	if(!ctx.showUsers)
		return;

	Print(ctx, "[");

	if(value->hasSideEffects)
		Print(ctx, "self");

	for(unsigned i = 0; i < value->users.size(); i++)
	{
		if(value->hasSideEffects || i != 0)
			Print(ctx, ", ");

		PrintName(ctx, value->users[i], fullNames, true);
	}

	Print(ctx, "] ");
}